

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl::commitAWB_RB(Private_Impl *this)

{
  MMAL_STATUS_T MVar1;
  MMAL_PARAMETER_HEADER_T local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_20.id = 0x10044;
  local_20.size = 0x18;
  local_18 = (undefined4)(long)((this->State).awbg_red * 65536.0);
  local_10 = (undefined4)(long)((this->State).awbg_blue * 65536.0);
  local_c = 0x10000;
  local_14 = 0x10000;
  MVar1 = mmal_port_parameter_set(((this->State).camera_component)->control,&local_20);
  if (MVar1 != MMAL_SUCCESS) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"commitAWB_RB",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": Failed to set AWBG gains parameter.\n",0x26);
  }
  return;
}

Assistant:

void Private_Impl::commitAWB_RB() {
           MMAL_PARAMETER_AWB_GAINS_T param = {{MMAL_PARAMETER_CUSTOM_AWB_GAINS,sizeof(param)}, {0,0}, {0,0}};
           param.r_gain.num = (unsigned int)(State.awbg_red * 65536);
           param.b_gain.num = (unsigned int)(State.awbg_blue * 65536);
           param.r_gain.den = param.b_gain.den = 65536;
           if ( mmal_port_parameter_set(State.camera_component->control, &param.hdr) != MMAL_SUCCESS )
                cout << __func__ << ": Failed to set AWBG gains parameter.\n";
        }